

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O0

void mod2sparse_copyrows(mod2sparse *m,mod2sparse *r,int *rows)

{
  long in_RDX;
  mod2sparse *in_RSI;
  mod2sparse *in_RDI;
  int i;
  mod2entry *e;
  int local_24;
  mod2entry *local_20;
  
  if (in_RSI->n_cols < in_RDI->n_cols) {
    fprintf(_stderr,"mod2sparse_copyrows: Destination matrix has fewer columns than source\n");
    exit(1);
  }
  mod2sparse_clear(in_RSI);
  local_24 = 0;
  while( true ) {
    if (in_RSI->n_rows <= local_24) {
      return;
    }
    if ((*(int *)(in_RDX + (long)local_24 * 4) < 0) ||
       (in_RDI->n_rows <= *(int *)(in_RDX + (long)local_24 * 4))) break;
    for (local_20 = in_RDI->rows[*(int *)(in_RDX + (long)local_24 * 4)].right; -1 < local_20->row;
        local_20 = local_20->right) {
      mod2sparse_insert(in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
    }
    local_24 = local_24 + 1;
  }
  fprintf(_stderr,"mod2sparse_copyrows: Row index out of range\n");
  exit(1);
}

Assistant:

void mod2sparse_copyrows
( mod2sparse *m,	/* Matrix to copy */
  mod2sparse *r,	/* Place to store copy of matrix */
  int *rows		/* Indexes of rows to copy, from 0 */
)
{ 
  mod2entry *e;
  int i;

  if (mod2sparse_cols(m)>mod2sparse_cols(r))
  { fprintf(stderr,
     "mod2sparse_copyrows: Destination matrix has fewer columns than source\n");
    exit(1);
  }

  mod2sparse_clear(r);

  for (i = 0; i<mod2sparse_rows(r); i++)
  { if (rows[i]<0 || rows[i]>=mod2sparse_rows(m))
    { fprintf(stderr,"mod2sparse_copyrows: Row index out of range\n");
      exit(1);
    }
    e = mod2sparse_first_in_row(m,rows[i]);
    while (!mod2sparse_at_end(e))
    { mod2sparse_insert(r,i,e->col);
      e = mod2sparse_next_in_row(e);
    }
  }
}